

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_f89de::AddLoadInfo(VmModule *module,VmInstruction *inst)

{
  VmConstant *pVVar1;
  TypeBase *pTVar2;
  long lVar3;
  VmValue **ppVVar4;
  VmConstant *pVVar5;
  LoadStoreInfo local_70;
  
  local_70.storeInst = (VmInstruction *)0x0;
  local_70.copyInst = (VmInstruction *)0x0;
  local_70.loadAddress = (VmConstant *)0x0;
  local_70.loadPointer = (VmValue *)0x0;
  local_70.loadOffset = (VmConstant *)0x0;
  local_70.storeAddress = (VmConstant *)0x0;
  local_70.storePointer = (VmValue *)0x0;
  local_70.storeOffset = (VmConstant *)0x0;
  local_70.loadInst = inst;
  local_70.accessSize = GetAccessSize(inst);
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
  pVVar1 = (VmConstant *)*ppVVar4;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
  pVVar5 = (VmConstant *)*ppVVar4;
  if ((pVVar5 == (VmConstant *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
    pVVar5 = (VmConstant *)0x0;
  }
  if ((pVVar1 == (VmConstant *)0x0) || ((pVVar1->super_VmValue).typeID != 1)) {
    local_70.noLoadOrNoContainerAlias = pVVar1 == (VmConstant *)0x0;
    local_70.loadPointer = (VmValue *)pVVar1;
    local_70.loadOffset = pVVar5;
  }
  else {
    if (pVVar1->container == (VariableData *)0x0) {
      return;
    }
    if (pVVar5->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x5b0,"void (anonymous namespace)::AddLoadInfo(VmModule *, VmInstruction *)");
    }
    pTVar2 = pVVar1->container->type;
    if (((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x13)) &&
       (lVar3._0_4_ = pTVar2[1].typeID, lVar3._4_4_ = pTVar2[1].nameHash, 0x20 < lVar3)) {
      return;
    }
    local_70.loadAddress = pVVar1;
    if (pVVar1->container == (VariableData *)0x0) {
      local_70.noLoadOrNoContainerAlias = false;
    }
    else {
      local_70.noLoadOrNoContainerAlias = HasAddressTaken(pVVar1->container);
      local_70.noLoadOrNoContainerAlias = !local_70.noLoadOrNoContainerAlias;
    }
  }
  local_70.noStoreOrNoContainerAlias = true;
  SmallArray<VmModule::LoadStoreInfo,_32U>::push_back(&module->loadStoreInfo,&local_70);
  return;
}

Assistant:

void AddLoadInfo(VmModule *module, VmInstruction* inst)
	{
		VmModule::LoadStoreInfo info;

		info.loadInst = inst;

		info.accessSize = GetAccessSize(inst);

		VmValue *loadPointer = inst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(inst->arguments[1]);

		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return;

			assert(loadOffset->iValue == 0);

			// Do not track load-store into large arrays
			if(TypeArray *typeArray = getType<TypeArray>(loadAddress->container->type))
			{
				if(typeArray->length > 32)
					return;
			}

			info.loadAddress = loadAddress;
		}
		else
		{
			info.loadPointer = loadPointer;
			info.loadOffset = loadOffset;
		}

		info.noLoadOrNoContainerAlias = !(info.loadAddress || info.loadPointer) || (info.loadAddress && info.loadAddress->container && !HasAddressTaken(info.loadAddress->container));
		info.noStoreOrNoContainerAlias = !(info.storeAddress || info.storePointer) || (info.storeAddress && info.storeAddress->container && !HasAddressTaken(info.storeAddress->container));

		module->loadStoreInfo.push_back(info);
	}